

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::BoolConstant,spvtools::opt::analysis::Bool_const*,bool_const&>
          (spvtools *this,Bool **args,bool *args_1)

{
  BoolConstant *this_00;
  bool *args_local_1;
  Bool **args_local;
  
  this_00 = (BoolConstant *)::operator_new(0x30);
  opt::analysis::BoolConstant::BoolConstant(this_00,*args,(bool)(*args_1 & 1));
  std::
  unique_ptr<spvtools::opt::analysis::BoolConstant,std::default_delete<spvtools::opt::analysis::BoolConstant>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::BoolConstant>,void>
            ((unique_ptr<spvtools::opt::analysis::BoolConstant,std::default_delete<spvtools::opt::analysis::BoolConstant>>
              *)this,this_00);
  return (__uniq_ptr_data<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}